

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O1

bool __thiscall Fossilize::VulkanDevice::init_device(VulkanDevice *this,Options *opts)

{
  VkInstance *ppVVar1;
  VkPhysicalDeviceFeatures2 *__src;
  VkApplicationInfo *app_info;
  Options *pOVar2;
  pointer ppcVar3;
  pointer ppcVar4;
  bool bVar5;
  bool bVar6;
  VkResult VVar7;
  uint32_t uVar8;
  int iVar9;
  uint uVar10;
  VkPhysicalDevice *ppVVar11;
  PFN_vkGetPhysicalDeviceProperties2KHR *pp_Var12;
  int *piVar13;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_> _Var14
  ;
  pointer pVVar15;
  ulong uVar16;
  VkExtensionProperties *ext_1;
  VkLayerProperties *pVVar17;
  uint uVar18;
  VkPhysicalDeviceProperties2 *pVVar19;
  VkQueueFamilyProperties *pVVar20;
  uint32_t *layer;
  VkPhysicalDevice pVVar21;
  VkExtensionProperties *ext;
  VkPhysicalDeviceFeatures2 *target_features;
  VulkanDevice *pVVar22;
  uint uVar23;
  char *candidate;
  uint32_t gpu_count;
  uint32_t device_layer_count;
  uint32_t device_ext_count;
  uint32_t ext_count;
  vector<const_char_*,_std::allocator<const_char_*>_> active_device_extensions;
  vector<const_char_*,_std::allocator<const_char_*>_> active_exts;
  VkDeviceCreateInfo device_info;
  vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> gpus;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> exts;
  vector<const_char_*,_std::allocator<const_char_*>_> active_device_layers;
  vector<const_char_*,_std::allocator<const_char_*>_> active_layers;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> device_ext_props;
  uint32_t validation_ext_count;
  uint32_t family_count;
  VkInstanceCreateInfo instance_info;
  VkPhysicalDevicePipelineExecutablePropertiesFeaturesKHR stats_feature;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> validation_extensions;
  VkDeviceQueueCreateInfo queue_info;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> queue_props;
  size_t active_extension_count;
  VkPhysicalDeviceFeatures2 replacement_pdf2;
  VkPhysicalDeviceFeatures2 gpu_features2;
  VkPhysicalDeviceProperties2 gpu_props2;
  VkApplicationInfo app;
  uint32_t local_7dc;
  VulkanDevice *local_7d8;
  uint32_t local_7cc;
  uint32_t local_7c8;
  uint32_t local_7c4;
  Options *local_7c0;
  vector<const_char_*,_std::allocator<const_char_*>_> local_7b8;
  char **local_798;
  iterator iStack_790;
  char **local_788;
  undefined1 local_778 [16];
  pointer local_768;
  VkDeviceQueueCreateInfo *pVStack_760;
  ulong local_758;
  pointer pVStack_750;
  ulong local_748;
  pointer pVStack_740;
  pointer local_738;
  vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> local_728;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> local_710;
  vector<const_char_*,_std::allocator<const_char_*>_> local_6f8;
  vector<const_char_*,_std::allocator<const_char_*>_> local_6d8;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> local_6c0;
  char *local_6a8;
  uint32_t local_6a0;
  uint32_t local_69c;
  VkInstanceCreateInfo local_698;
  undefined8 local_658;
  void *pvStack_650;
  undefined8 local_648;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> local_640;
  VkDeviceQueueCreateInfo local_628;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> local_5f8;
  size_type local_5e0;
  undefined4 local_5d8;
  undefined4 uStack_5d4;
  undefined4 local_5d0;
  undefined4 uStack_5cc;
  undefined4 local_5c8;
  undefined4 uStack_5c4;
  undefined8 uStack_5c0;
  undefined4 local_5b8;
  undefined4 local_5b4;
  undefined4 uStack_5b0;
  undefined4 uStack_5ac;
  VkBool32 VStack_5a8;
  VkBool32 VStack_5a4;
  undefined8 uStack_5a0;
  VkPhysicalDeviceFeatures2 local_598;
  undefined1 local_4a8 [16];
  undefined1 local_498 [224];
  undefined1 local_3b8 [16];
  pointer local_3a8;
  code *pcStack_3a0;
  VulkanDevice *local_398;
  VkApplicationInfo local_68;
  
  if (opts->null_device == true) {
    init_null_device(this);
    return true;
  }
  VVar7 = volkInitialize();
  if (VVar7 != VK_SUCCESS) {
    init_device();
    return false;
  }
  uVar8 = volkGetInstanceVersion();
  uVar18 = uVar8 & 0xfffff000;
  if (uVar18 == 0) {
    init_device();
    return false;
  }
  uVar23 = uVar18;
  if (opts->application_info != (VkApplicationInfo *)0x0) {
    uVar23 = opts->application_info->apiVersion & 0xfffff000;
  }
  if (uVar18 < uVar23) {
    init_device();
    return false;
  }
  local_7c4 = 0;
  VVar7 = (*vkEnumerateInstanceExtensionProperties)
                    ((char *)0x0,&local_7c4,(VkExtensionProperties *)0x0);
  if (VVar7 != VK_SUCCESS) {
    return false;
  }
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::vector
            (&local_710,(ulong)local_7c4,(allocator_type *)local_3b8);
  if (local_7c4 != 0) {
    bVar5 = false;
    VVar7 = (*vkEnumerateInstanceExtensionProperties)
                      ((char *)0x0,&local_7c4,
                       local_710.
                       super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (VVar7 != VK_SUCCESS) goto LAB_00104536;
  }
  local_6d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7c0 = opts;
  if (opts->enable_validation == true) {
    local_598.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    VVar7 = (*vkEnumerateInstanceLayerProperties)(&local_598.sType,(VkLayerProperties *)0x0);
    if (VVar7 == VK_SUCCESS) {
      std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::vector
                ((vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)local_3b8,
                 (ulong)local_598.sType,(allocator_type *)local_4a8);
      pVVar17 = (VkLayerProperties *)local_3b8._0_8_;
      VVar7 = (*vkEnumerateInstanceLayerProperties)
                        (&local_598.sType,(VkLayerProperties *)local_3b8._0_8_);
      if (VVar7 == VK_SUCCESS) {
        bVar5 = find_layer((vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)
                           local_3b8,pVVar17->layerName);
        if (bVar5) {
          local_4a8._0_8_ = "VK_LAYER_KHRONOS_validation";
          std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                    (&local_6d8,(value_type *)local_4a8);
          if ((VkLayerProperties *)local_3b8._0_8_ != (VkLayerProperties *)0x0) {
            operator_delete((void *)local_3b8._0_8_,(long)local_3a8 - local_3b8._0_8_);
          }
          goto LAB_00104245;
        }
        init_device();
      }
      if ((VkLayerProperties *)local_3b8._0_8_ != (VkLayerProperties *)0x0) {
        operator_delete((void *)local_3b8._0_8_,(long)local_3a8 - local_3b8._0_8_);
      }
    }
    bVar5 = false;
  }
  else {
LAB_00104245:
    pOVar2 = local_7c0;
    bVar5 = find_extension(&local_710,"VK_EXT_debug_report");
    local_698.pNext = (void *)0x0;
    local_698.enabledExtensionCount = 0;
    local_698._52_4_ = 0;
    local_698.ppEnabledExtensionNames = (char **)0x0;
    local_698.flags = 0;
    local_698._20_4_ = 0;
    local_698.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
    local_698._4_4_ = 0;
    local_68.applicationVersion = 0;
    local_68._28_4_ = 0;
    local_68.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    local_68._4_4_ = 0;
    local_68.pNext = (void *)0x0;
    local_68._40_8_ = ((ulong)uVar8 & 0xfffff000) << 0x20;
    local_68.pApplicationName = "Fossilize Replayer";
    local_68.pEngineName = "Fossilize";
    local_698.ppEnabledLayerNames = (pointer)0x0;
    if ((long)local_6d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_6d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      local_698.ppEnabledLayerNames =
           local_6d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    uVar16 = (ulong)((long)local_6d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_6d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3;
    local_698._32_8_ = uVar16 & 0xffffffff;
    local_698.pApplicationInfo = pOVar2->application_info;
    if (pOVar2->application_info == (VkApplicationInfo *)0x0) {
      local_698.pApplicationInfo = &local_68;
    }
    if ((int)uVar16 != 0) {
      init_device();
    }
    local_7d8 = this;
    if (local_698.enabledExtensionCount != 0) {
      init_device();
    }
    local_798 = (char **)0x0;
    iStack_790._M_current = (char **)0x0;
    local_788 = (char **)0x0;
    if (local_710.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_710.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pVVar17 = (VkLayerProperties *)
                local_710.
                super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        if ((0x400fff < (local_698.pApplicationInfo)->apiVersion) ||
           (iVar9 = strcmp("VK_KHR_surface_protected_capabilities",pVVar17->layerName), iVar9 != 0))
        {
          local_3b8._0_8_ = pVVar17;
          if (iStack_790._M_current == local_788) {
            std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                      ((vector<char_const*,std::allocator<char_const*>> *)&local_798,iStack_790,
                       (char **)local_3b8);
          }
          else {
            *iStack_790._M_current = pVVar17->layerName;
            iStack_790._M_current = iStack_790._M_current + 1;
          }
        }
        pVVar17 = (VkLayerProperties *)&pVVar17->implementationVersion;
      } while (pVVar17 !=
               (VkLayerProperties *)
               local_710.
               super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    pVVar22 = local_7d8;
    local_698.ppEnabledExtensionNames = local_798;
    if ((long)iStack_790._M_current - (long)local_798 == 0) {
      local_698.ppEnabledExtensionNames = (char **)0x0;
    }
    local_698.enabledExtensionCount =
         (uint32_t)((ulong)((long)iStack_790._M_current - (long)local_798) >> 3);
    ppVVar1 = &local_7d8->instance;
    VVar7 = (*vkCreateInstance)(&local_698,(VkAllocationCallbacks *)0x0,ppVVar1);
    if (VVar7 == VK_SUCCESS) {
      volkLoadInstance(*ppVVar1);
      if (bVar5) {
        local_3b8._8_8_ = (pointer)0x0;
        local_3b8._0_8_ = (VkLayerProperties *)0x3b9af4f8;
        pcStack_3a0 = debug_callback;
        local_3a8 = (pointer)0x8;
        local_398 = pVVar22;
        bVar5 = false;
        VVar7 = (*vkCreateDebugReportCallbackEXT)
                          (pVVar22->instance,(VkDebugReportCallbackCreateInfoEXT *)local_3b8,
                           (VkAllocationCallbacks *)0x0,&pVVar22->callback);
        if (VVar7 != VK_SUCCESS) goto LAB_00104502;
      }
      local_7dc = 0;
      bVar5 = false;
      VVar7 = (*vkEnumeratePhysicalDevices)(*ppVVar1,&local_7dc,(VkPhysicalDevice *)0x0);
      if (VVar7 == VK_SUCCESS) {
        std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::vector
                  (&local_728,(ulong)local_7dc,(allocator_type *)local_3b8);
        if (local_7dc == 0) {
          init_device();
LAB_001044a4:
          bVar5 = false;
        }
        else {
          VVar7 = (*vkEnumeratePhysicalDevices)
                            (*ppVVar1,&local_7dc,
                             local_728.
                             super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          if (VVar7 != VK_SUCCESS) goto LAB_001044a4;
          if (local_7dc != 0) {
            init_device();
          }
          pOVar2 = local_7c0;
          uVar16 = (ulong)local_7c0->device_index;
          ppVVar11 = local_728.
                     super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (-1 < (long)uVar16) {
            if ((ulong)((long)local_728.
                              super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_728.
                              super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar16) {
              init_device();
              goto LAB_001044a4;
            }
            ppVVar11 = local_728.
                       super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar16;
          }
          pVVar21 = *ppVVar11;
          pVVar22->gpu = pVVar21;
          (*vkGetPhysicalDeviceProperties)(pVVar21,&pVVar22->gpu_props);
          fwrite("Fossilize INFO: Chose GPU:\n",0x1b,1,_stderr);
          fflush(_stderr);
          fprintf(_stderr,"Fossilize INFO:   name: %s\n",(pVVar22->gpu_props).deviceName);
          fflush(_stderr);
          uVar10 = (pVVar22->gpu_props).apiVersion;
          fprintf(_stderr,"Fossilize INFO:   apiVersion: %u.%u.%u\n",(ulong)(uVar10 >> 0x16),
                  (ulong)(uVar10 >> 0xc & 0x3ff),(ulong)(uVar10 & 0xfff));
          fflush(_stderr);
          fprintf(_stderr,"Fossilize INFO:   vendorID: 0x%x\n",(ulong)(pVVar22->gpu_props).vendorID)
          ;
          fflush(_stderr);
          fprintf(_stderr,"Fossilize INFO:   deviceID: 0x%x\n",(ulong)(pVVar22->gpu_props).deviceID)
          ;
          fflush(_stderr);
          uVar10 = (pVVar22->gpu_props).apiVersion & 0xfffff000;
          if (uVar10 <= uVar18) {
            uVar18 = uVar10;
          }
          if (pOVar2->application_info == (VkApplicationInfo *)0x0) {
            uVar23 = uVar18;
          }
          if (uVar10 < uVar23) {
            init_device();
            goto LAB_001044a4;
          }
          pVVar22->api_version = uVar23;
          local_7b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_7b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (char **)0x0;
          local_7b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_7c8 = 0;
          bVar5 = false;
          VVar7 = (*vkEnumerateDeviceExtensionProperties)
                            (pVVar22->gpu,(char *)0x0,&local_7c8,(VkExtensionProperties *)0x0);
          if (VVar7 == VK_SUCCESS) {
            std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::vector
                      (&local_6c0,(ulong)local_7c8,(allocator_type *)local_3b8);
            if (local_7c8 == 0) {
LAB_0010473e:
              if (local_6c0.
                  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  local_6c0.
                  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                pVVar17 = (VkLayerProperties *)
                          local_6c0.
                          super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  bVar5 = filter_extension(pVVar17->layerName,local_7c0->want_amd_shader_info,
                                           &local_6c0,local_7d8->api_version);
                  if (bVar5) {
                    local_3b8._0_8_ = pVVar17;
                    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                              (&local_7b8,(value_type *)local_3b8);
                  }
                  pVVar17 = (VkLayerProperties *)&pVVar17->implementationVersion;
                } while (pVVar17 !=
                         (VkLayerProperties *)
                         local_6c0.
                         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
              bVar5 = find_extension(&local_710,"VK_KHR_get_physical_device_properties2");
              memset(local_4a8,0,0xf0);
              pVVar22 = local_7d8;
              local_4a8._0_4_ = 0x3b9bb078;
              local_4a8._8_8_ = &local_658;
              local_648 = 0;
              local_658 = 0x3b9ee4c8;
              pvStack_650 = (void *)0x0;
              if (bVar5) {
                pvStack_650 = build_pnext_chain(&local_7d8->features,local_7d8->api_version,
                                                local_7b8.
                                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (uint32_t)
                                                ((ulong)((long)local_7b8.
                                                                                                                              
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_7b8.
                                                                                                                
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3));
                (*vkGetPhysicalDeviceFeatures2KHR)
                          (pVVar22->gpu,(VkPhysicalDeviceFeatures2 *)local_4a8);
                pVVar22->pipeline_stats = (int)local_648 != 0;
                if (((int)local_648 == 0) || (local_7c0->want_pipeline_stats != true)) {
                  local_648 = (ulong)local_648._4_4_ << 0x20;
                }
                else {
                  local_648 = CONCAT44(local_648._4_4_,1);
                }
              }
              else {
                (*vkGetPhysicalDeviceFeatures)(local_7d8->gpu,(VkPhysicalDeviceFeatures *)local_498)
                ;
              }
              pOVar2 = local_7c0;
              memset(local_3b8,0,0x348);
              local_3b8._0_4_ = 0x3b9bb079;
              if (bVar5) {
                local_3b8._8_8_ =
                     build_pnext_chain(&pVVar22->props,pVVar22->api_version,
                                       local_7b8.
                                       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                       (uint32_t)
                                       ((ulong)((long)local_7b8.
                                                                                                            
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)local_7b8.
                                                                                                          
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3));
                pVVar19 = (VkPhysicalDeviceProperties2 *)local_3b8;
                pp_Var12 = &vkGetPhysicalDeviceProperties2KHR;
                pVVar21 = pVVar22->gpu;
              }
              else {
                pVVar21 = pVVar22->gpu;
                pVVar19 = (VkPhysicalDeviceProperties2 *)&local_3a8;
                pp_Var12 = (PFN_vkGetPhysicalDeviceProperties2KHR *)&vkGetPhysicalDeviceProperties;
              }
              (**pp_Var12)(pVVar21,pVVar19);
              __src = pOVar2->features;
              target_features = __src;
              if (__src != (VkPhysicalDeviceFeatures2 *)0x0) {
                app_info = pOVar2->application_info;
                bVar6 = application_info_promote_robustness2(app_info);
                if (bVar6) {
                  for (piVar13 = (int *)__src->pNext; piVar13 != (int *)0x0;
                      piVar13 = *(int **)(piVar13 + 2)) {
                    if (*piVar13 == 0x3b9f2730) goto LAB_0010497b;
                  }
                  piVar13 = (int *)0x0;
LAB_0010497b:
                  if (piVar13 == (int *)0x0) {
                    VStack_5a4 = 0;
                    uStack_5a0 = 0;
                    local_5b4 = 0;
                    uStack_5b0 = 0;
                    uStack_5ac = 0;
                    VStack_5a8 = 0;
                    local_5b8 = 0x3b9f2730;
                    if (&local_598 != __src) {
                      memcpy(&local_598,__src,0xf0);
                      target_features = &local_598;
                    }
                    uStack_5b0 = SUB84(local_598.pNext,0);
                    uStack_5ac = (undefined4)((ulong)local_598.pNext >> 0x20);
                    VStack_5a8 = (__src->features).robustBufferAccess;
                    uStack_5a0 = CONCAT44(uStack_5a0._4_4_,1);
                    VStack_5a4 = VStack_5a8;
                    local_598.pNext = &local_5b8;
                  }
                }
                if (((app_info != (VkApplicationInfo *)0x0) &&
                    (app_info->pEngineName != (char *)0x0)) &&
                   (iVar9 = strcmp("vkd3d",app_info->pEngineName), iVar9 == 0)) {
                  for (piVar13 = (int *)__src->pNext; piVar13 != (int *)0x0;
                      piVar13 = *(int **)(piVar13 + 2)) {
                    if (*piVar13 == 0x3b9e3cd3) goto LAB_00104a39;
                  }
                  piVar13 = (int *)0x0;
LAB_00104a39:
                  if (piVar13 == (int *)0x0) {
                    uStack_5c4 = 0;
                    uStack_5c0 = 0;
                    uStack_5d4 = 0;
                    local_5d0 = 0;
                    uStack_5cc = 0;
                    local_5c8 = 0;
                    local_5d8 = 0x3b9e3cd3;
                    if (&local_598 != target_features) {
                      memcpy(&local_598,target_features,0xf0);
                      target_features = &local_598;
                    }
                    local_5d0 = SUB84(local_598.pNext,0);
                    uStack_5cc = (undefined4)((ulong)local_598.pNext >> 0x20);
                    local_5c8 = 1;
                    uStack_5c4 = 1;
                    uStack_5c0 = CONCAT44(uStack_5c0._4_4_,1);
                    local_598.pNext = &local_5d8;
                  }
                }
              }
              pVVar22 = local_7d8;
              local_5e0 = (long)local_7b8.
                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_7b8.
                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3;
              filter_feature_enablement
                        ((VkPhysicalDeviceFeatures2 *)local_4a8,&local_7d8->features,target_features
                         ,local_7b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,&local_5e0);
              std::vector<const_char_*,_std::allocator<const_char_*>_>::resize(&local_7b8,local_5e0)
              ;
              local_69c = 0;
              (*vkGetPhysicalDeviceQueueFamilyProperties)
                        (pVVar22->gpu,&local_69c,(VkQueueFamilyProperties *)0x0);
              std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::vector
                        (&local_5f8,(ulong)local_69c,(allocator_type *)local_778);
              (*vkGetPhysicalDeviceQueueFamilyProperties)
                        (pVVar22->gpu,&local_69c,
                         local_5f8.
                         super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                         ._M_impl.super__Vector_impl_data._M_start);
              local_628.pNext = (void *)0x0;
              local_628.flags = 0;
              local_628.queueFamilyIndex = 0;
              local_628.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
              local_628._4_4_ = 0;
              local_628.pQueuePriorities = &init_device::one;
              local_628.queueCount = 1;
              local_628._28_4_ = 0;
              if (local_5f8.
                  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_5f8.
                  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                uVar16 = 0;
                do {
                  if ((*(int *)((long)&(local_5f8.
                                        super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->queueCount +
                               uVar16) != 0) &&
                     ((*(byte *)((long)&(local_5f8.
                                         super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->queueFlags +
                                uVar16) & 1) != 0)) {
                    local_628._16_8_ = (ulong)(uint)((int)(uVar16 >> 3) * -0x55555555) << 0x20;
                    break;
                  }
                  pVVar20 = (VkQueueFamilyProperties *)
                            ((long)&local_5f8.
                                    super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                    ._M_impl.super__Vector_impl_data._M_start[1].queueFlags + uVar16
                            );
                  uVar16 = uVar16 + 0x18;
                } while (pVVar20 !=
                         local_5f8.
                         super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
              local_6f8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_6f8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_6f8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if (local_7c0->enable_validation == true) {
                local_7cc = 0;
                VVar7 = (*vkEnumerateDeviceLayerProperties)
                                  (pVVar22->gpu,&local_7cc,(VkLayerProperties *)0x0);
                if (VVar7 == VK_SUCCESS) {
                  layer = (uint32_t *)(ulong)local_7cc;
                  std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::vector
                            ((vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)
                             local_778,(size_type)layer,(allocator_type *)&local_640);
                  if (local_7cc == 0) {
LAB_00104bee:
                    bVar6 = find_layer((vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>
                                        *)local_778,(char *)layer);
                    if (bVar6) {
                      local_640.
                      super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x11f175;
                      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                                (&local_6f8,(value_type *)&local_640);
                      pVVar22 = local_7d8;
                      local_6a0 = 0;
                      (*vkEnumerateDeviceExtensionProperties)
                                (local_7d8->gpu,"VK_LAYER_KHRONOS_validation",&local_6a0,
                                 (VkExtensionProperties *)0x0);
                      std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::
                      vector(&local_640,(ulong)local_6a0,(allocator_type *)&local_6a8);
                      (*vkEnumerateDeviceExtensionProperties)
                                (pVVar22->gpu,"VK_LAYER_KHRONOS_validation",&local_6a0,
                                 local_640.
                                 super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
                      bVar6 = find_extension(&local_640,"VK_EXT_validation_cache");
                      pVVar22->validation_cache = bVar6;
                      if (bVar6) {
                        local_6a8 = "VK_EXT_validation_cache";
                        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                                  (&local_7b8,&local_6a8);
                      }
                      if (local_640.
                          super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start != (VkExtensionProperties *)0x0)
                      {
                        operator_delete(local_640.
                                        super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_640.
                                              super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_640.
                                              super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      pVVar22 = local_7d8;
                      if ((VkLayerProperties *)local_778._0_8_ != (VkLayerProperties *)0x0) {
                        operator_delete((void *)local_778._0_8_,(long)local_768 - local_778._0_8_);
                        pVVar22 = local_7d8;
                      }
                      goto LAB_00104cdc;
                    }
                    init_device();
                  }
                  else {
                    layer = &local_7cc;
                    VVar7 = (*vkEnumerateDeviceLayerProperties)
                                      (local_7d8->gpu,layer,(VkLayerProperties *)local_778._0_8_);
                    if (VVar7 == VK_SUCCESS) goto LAB_00104bee;
                  }
                  if ((VkLayerProperties *)local_778._0_8_ != (VkLayerProperties *)0x0) {
                    operator_delete((void *)local_778._0_8_,(long)local_768 - local_778._0_8_);
                  }
                }
LAB_00104b94:
                bVar5 = false;
              }
              else {
LAB_00104cdc:
                ppcVar4 = local_7b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
                ppcVar3 = local_7b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                _Var14 = std::
                         find_if<__gnu_cxx::__normal_iterator<char_const**,std::vector<char_const*,std::allocator<char_const*>>>,Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::__1>
                                   (local_7b8.
                                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    local_7b8.
                                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish);
                pVVar22->supports_pipeline_feedback = _Var14._M_current != ppcVar4;
                _Var14 = std::
                         find_if<__gnu_cxx::__normal_iterator<char_const**,std::vector<char_const*,std::allocator<char_const*>>>,Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::__2>
                                   (ppcVar3,ppcVar4);
                pVVar22->amd_shader_info = _Var14._M_current != ppcVar4;
                pVVar22->supports_module_identifiers =
                     (pVVar22->features).shader_module_identifier.shaderModuleIdentifier == 1;
                pVVar15 = (pointer)0x0;
                local_778._8_8_ = (pointer)local_4a8;
                if (!bVar5) {
                  local_778._8_8_ = pVVar15;
                }
                local_778._0_8_ = (VkLayerProperties *)0x3;
                local_738 = (pointer)local_498;
                if (bVar5) {
                  local_738 = pVVar15;
                }
                pVStack_760 = &local_628;
                local_768 = (pointer)0x100000000;
                pVStack_750 = (pointer)local_6f8.
                                       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                if ((long)local_6f8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_6f8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start == 0) {
                  pVStack_750 = pVVar15;
                }
                uVar16 = (ulong)((long)local_6f8.
                                       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_6f8.
                                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3;
                local_758 = uVar16 & 0xffffffff;
                pVStack_740 = (pointer)ppcVar3;
                if ((long)ppcVar4 - (long)ppcVar3 == 0) {
                  pVStack_740 = pVVar15;
                }
                local_748 = (ulong)((long)ppcVar4 - (long)ppcVar3) >> 3 & 0xffffffff;
                if ((pVStack_750 != (pointer)0x0) && ((int)uVar16 != 0)) {
                  init_device();
                }
                if ((pVStack_740 != (pointer)0x0) && ((uint32_t)local_748 != 0)) {
                  init_device();
                }
                VVar7 = (*vkCreateDevice)(pVVar22->gpu,(VkDeviceCreateInfo *)local_778,
                                          (VkAllocationCallbacks *)0x0,&pVVar22->device);
                if (VVar7 != VK_SUCCESS) {
                  init_device();
                  goto LAB_00104b94;
                }
                iVar9 = FeatureFilter::init(&pVVar22->feature_filter,
                                            (EVP_PKEY_CTX *)(ulong)pVVar22->api_version);
                if ((char)iVar9 == '\0') {
                  init_device();
                  goto LAB_00104b94;
                }
                FeatureFilter::set_device_query_interface
                          (&pVVar22->feature_filter,&pVVar22->super_DeviceQueryInterface);
                bVar5 = true;
              }
              if ((pointer)local_6f8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                           ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_6f8.
                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_6f8.
                                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_6f8.
                                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_5f8.
                  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                  ._M_impl.super__Vector_impl_data._M_start != (VkQueueFamilyProperties *)0x0) {
                operator_delete(local_5f8.
                                super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_5f8.
                                      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_5f8.
                                      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
            else {
              bVar5 = false;
              VVar7 = (*vkEnumerateDeviceExtensionProperties)
                                (pVVar22->gpu,(char *)0x0,&local_7c8,
                                 local_6c0.
                                 super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
              if (VVar7 == VK_SUCCESS) goto LAB_0010473e;
            }
            if ((VkLayerProperties *)
                local_6c0.
                super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
                _M_impl.super__Vector_impl_data._M_start != (VkLayerProperties *)0x0) {
              operator_delete(local_6c0.
                              super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_6c0.
                                    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_6c0.
                                    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          if ((pointer)local_7b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                       _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_7b8.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_7b8.
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_7b8.
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        if (local_728.
            super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
            super__Vector_impl_data._M_start != (VkPhysicalDevice *)0x0) {
          operator_delete(local_728.
                          super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_728.
                                super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_728.
                                super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
    }
    else {
      init_device();
      bVar5 = false;
    }
LAB_00104502:
    if (local_798 != (char **)0x0) {
      operator_delete(local_798,(long)local_788 - (long)local_798);
    }
  }
  if (local_6d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_6d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
LAB_00104536:
  if ((VkLayerProperties *)
      local_710.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
      _M_impl.super__Vector_impl_data._M_start != (VkLayerProperties *)0x0) {
    operator_delete(local_710.
                    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_710.
                          super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_710.
                          super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    return bVar5;
  }
  return bVar5;
}

Assistant:

bool VulkanDevice::init_device(const Options &opts)
{
	if (opts.null_device)
	{
		init_null_device();
		return true;
	}

	if (volkInitialize() != VK_SUCCESS)
	{
		LOGE("volkInitialize failed.\n");
		return false;
	}

	uint32_t instance_api_version = major_minor_version(volkGetInstanceVersion());
	if (instance_api_version == 0)
	{
		LOGE("Could not find loader.\n");
		return false;
	}

	uint32_t target_api_version = opts.application_info ? opts.application_info->apiVersion : instance_api_version;
	target_api_version = major_minor_version(target_api_version);

	if (target_api_version > instance_api_version)
	{
		LOGE("Database is targeting an API version which is unsupported by this Vulkan loader.\n");
		return false;
	}

	// Enable all extensions (FIXME: this is likely a problem).
	uint32_t ext_count = 0;
	if (vkEnumerateInstanceExtensionProperties(nullptr, &ext_count, nullptr) != VK_SUCCESS)
		return false;
	vector<VkExtensionProperties> exts(ext_count);
	if (ext_count && vkEnumerateInstanceExtensionProperties(nullptr, &ext_count, exts.data()) != VK_SUCCESS)
		return false;

	vector<const char *> active_layers;
	if (opts.enable_validation)
	{
		uint32_t layer_count = 0;
		if (vkEnumerateInstanceLayerProperties(&layer_count, nullptr) != VK_SUCCESS)
			return false;
		vector<VkLayerProperties> layers(layer_count);
		if (vkEnumerateInstanceLayerProperties(&layer_count, layers.data()) != VK_SUCCESS)
			return false;

		if (find_layer(layers, "VK_LAYER_KHRONOS_validation"))
			active_layers.push_back("VK_LAYER_KHRONOS_validation");
		else
		{
			LOGE("Cannot find VK_LAYER_KHRONOS_validation layer.\n");
			return false;
		}
	}

	bool use_debug_callback = find_extension(exts, VK_EXT_DEBUG_REPORT_EXTENSION_NAME);

	VkInstanceCreateInfo instance_info = { VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO };
	VkApplicationInfo app = { VK_STRUCTURE_TYPE_APPLICATION_INFO };
	app.apiVersion = instance_api_version;
	app.pApplicationName = "Fossilize Replayer";
	app.pEngineName = "Fossilize";

	instance_info.enabledLayerCount = uint32_t(active_layers.size());
	instance_info.ppEnabledLayerNames = active_layers.empty() ? nullptr : active_layers.data();
	instance_info.pApplicationInfo = opts.application_info ? opts.application_info : &app;

	for (uint32_t i = 0; i < instance_info.enabledLayerCount; i++)
		LOGI("Enabling instance layer: %s\n", instance_info.ppEnabledLayerNames[i]);
	for (uint32_t i = 0; i < instance_info.enabledExtensionCount; i++)
		LOGI("Enabling instance extension: %s\n", instance_info.ppEnabledExtensionNames[i]);

	vector<const char *> active_exts;
	for (auto &ext : exts)
		if (filter_instance_extension(ext.extensionName, instance_info.pApplicationInfo->apiVersion))
			active_exts.push_back(ext.extensionName);

	instance_info.enabledExtensionCount = uint32_t(active_exts.size());
	instance_info.ppEnabledExtensionNames = active_exts.empty() ? nullptr : active_exts.data();

	if (vkCreateInstance(&instance_info, nullptr, &instance) != VK_SUCCESS)
	{
		LOGE("Failed to create instance.\n");
		return false;
	}

	volkLoadInstance(instance);

	if (use_debug_callback)
	{
		VkDebugReportCallbackCreateInfoEXT cb_info = { VK_STRUCTURE_TYPE_DEBUG_REPORT_CALLBACK_CREATE_INFO_EXT };
		cb_info.pfnCallback = debug_callback;
		cb_info.flags = VK_DEBUG_REPORT_ERROR_BIT_EXT;
		cb_info.pUserData = this;

		if (vkCreateDebugReportCallbackEXT(instance, &cb_info, nullptr, &callback) != VK_SUCCESS)
			return false;
	}

	uint32_t gpu_count = 0;
	if (vkEnumeratePhysicalDevices(instance, &gpu_count, nullptr) != VK_SUCCESS)
		return false;
	vector<VkPhysicalDevice> gpus(gpu_count);

	if (!gpu_count)
	{
		LOGE("No physical devices.\n");
		return false;
	}

	if (vkEnumeratePhysicalDevices(instance, &gpu_count, gpus.data()) != VK_SUCCESS)
		return false;

	for (uint32_t i = 0; i < gpu_count; i++)
	{
		vkGetPhysicalDeviceProperties(gpus[i], &gpu_props);
		LOGI("Enumerated GPU #%u:\n", i);
		LOGI("  name: %s\n", gpu_props.deviceName);
		LOGI("  apiVersion: %u.%u.%u\n",
		     VK_VERSION_MAJOR(gpu_props.apiVersion),
		     VK_VERSION_MINOR(gpu_props.apiVersion),
		     VK_VERSION_PATCH(gpu_props.apiVersion));
	}

	if (opts.device_index >= 0)
	{
		if (size_t(opts.device_index) >= gpus.size())
		{
			LOGE("Device index %d is out of range, only %u devices on system.\n",
			     opts.device_index, unsigned(gpus.size()));
			return false;
		}
		gpu = gpus[opts.device_index];
	}
	else
		gpu = gpus.front();

	vkGetPhysicalDeviceProperties(gpu, &gpu_props);
	LOGI("Chose GPU:\n");
	LOGI("  name: %s\n", gpu_props.deviceName);
	LOGI("  apiVersion: %u.%u.%u\n",
	     VK_VERSION_MAJOR(gpu_props.apiVersion),
	     VK_VERSION_MINOR(gpu_props.apiVersion),
	     VK_VERSION_PATCH(gpu_props.apiVersion));
	LOGI("  vendorID: 0x%x\n", gpu_props.vendorID);
	LOGI("  deviceID: 0x%x\n", gpu_props.deviceID);

	uint32_t gpu_api_version = major_minor_version(gpu_props.apiVersion);
	if (!opts.application_info)
		target_api_version = instance_api_version < gpu_api_version ? instance_api_version : gpu_api_version;

	if (target_api_version > gpu_api_version)
	{
		LOGE("Selected GPU does not support desired Vulkan API version.\n");
		return false;
	}

	api_version = target_api_version;

	vector<const char *> active_device_extensions;
	uint32_t device_ext_count = 0;
	if (vkEnumerateDeviceExtensionProperties(gpu, nullptr, &device_ext_count, nullptr) != VK_SUCCESS)
		return false;
	vector<VkExtensionProperties> device_ext_props(device_ext_count);
	if (device_ext_count && vkEnumerateDeviceExtensionProperties(gpu, nullptr, &device_ext_count, device_ext_props.data()) != VK_SUCCESS)
		return false;

	for (auto &ext : device_ext_props)
		if (filter_extension(ext.extensionName, opts.want_amd_shader_info, device_ext_props, api_version))
			active_device_extensions.push_back(ext.extensionName);

	bool has_device_features2 = find_extension(exts, VK_KHR_GET_PHYSICAL_DEVICE_PROPERTIES_2_EXTENSION_NAME);

	VkPhysicalDeviceFeatures2 gpu_features2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 };
	VkPhysicalDevicePipelineExecutablePropertiesFeaturesKHR stats_feature = {
		VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PIPELINE_EXECUTABLE_PROPERTIES_FEATURES_KHR
	};
	gpu_features2.pNext = &stats_feature;
	if (has_device_features2)
	{
		stats_feature.pNext = build_pnext_chain(features, api_version,
		                                        active_device_extensions.data(),
		                                        uint32_t(active_device_extensions.size()));
		vkGetPhysicalDeviceFeatures2KHR(gpu, &gpu_features2);

		pipeline_stats = stats_feature.pipelineExecutableInfo;
		if (pipeline_stats && opts.want_pipeline_stats)
			stats_feature.pipelineExecutableInfo = VK_TRUE;
		else
			stats_feature.pipelineExecutableInfo = VK_FALSE;
	}
	else
		vkGetPhysicalDeviceFeatures(gpu, &gpu_features2.features);

	VkPhysicalDeviceProperties2 gpu_props2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2 };
	if (has_device_features2)
	{
		gpu_props2.pNext = build_pnext_chain(props, api_version,
		                                     active_device_extensions.data(),
		                                     uint32_t(active_device_extensions.size()));
		vkGetPhysicalDeviceProperties2KHR(gpu, &gpu_props2);
	}
	else
		vkGetPhysicalDeviceProperties(gpu, &gpu_props2.properties);

	// A fairly ugly, but important workaround.
	// When replaying dxvk/vkd3d, we expect robustness2, but this was not captured on earlier databases,
	// which means we get different shader hashes when replaying.
	// For now, it's pragmatic to just enable robustness2 until old Fossils have been retired.
	// New fossils will capture robustness2.
	const auto *requested_pdf2 = opts.features;
	VkPhysicalDeviceFeatures2 replacement_pdf2;
	VkPhysicalDeviceRobustness2FeaturesEXT replacement_robustness2;
	VkPhysicalDeviceFragmentShadingRateFeaturesKHR replacement_fragment_shading_rate;

	const auto begin_replacement = [&](void *pnext) {
		if (&replacement_pdf2 != requested_pdf2)
		{
			replacement_pdf2 = *requested_pdf2;
			requested_pdf2 = &replacement_pdf2;
		}

		static_cast<VkBaseOutStructure *>(pnext)->pNext =
				static_cast<VkBaseOutStructure *>(replacement_pdf2.pNext);
		replacement_pdf2.pNext = pnext;
	};

	if (opts.features)
	{
		if (application_info_promote_robustness2(opts.application_info) &&
		    find_pnext<VkPhysicalDeviceRobustness2FeaturesEXT>(
				    VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT,
				    opts.features->pNext) == nullptr)
		{
			replacement_robustness2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT };
			begin_replacement(&replacement_robustness2);

			replacement_robustness2.robustBufferAccess2 = opts.features->features.robustBufferAccess;
			replacement_robustness2.robustImageAccess2 = opts.features->features.robustBufferAccess;
			replacement_robustness2.nullDescriptor = VK_TRUE;
		}

		if (application_info_promote_fragment_shading_rate(opts.application_info) &&
		    find_pnext<VkPhysicalDeviceFragmentShadingRateFeaturesKHR>(
				    VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR,
				    opts.features->pNext) == nullptr)
		{
			replacement_fragment_shading_rate = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR };
			begin_replacement(&replacement_fragment_shading_rate);
			reset_features(replacement_fragment_shading_rate, VK_TRUE);
		}
	}

	size_t active_extension_count = active_device_extensions.size();
	filter_feature_enablement(gpu_features2, features, requested_pdf2,
	                          active_device_extensions.data(), &active_extension_count);
	active_device_extensions.resize(active_extension_count);

	// Just pick one graphics queue.
	// FIXME: Does shader compilation depend on which queues we have enabled?
	// FIXME: Potentially separate code-gen if COMPUTE queue needs different optimizations, etc ...
	uint32_t family_count = 0;
	vkGetPhysicalDeviceQueueFamilyProperties(gpu, &family_count, nullptr);
	vector<VkQueueFamilyProperties> queue_props(family_count);
	vkGetPhysicalDeviceQueueFamilyProperties(gpu, &family_count, queue_props.data());

	VkDeviceQueueCreateInfo queue_info = { VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO };
	static float one = 1.0f;
	queue_info.pQueuePriorities = &one;
	queue_info.queueCount = 1;
	for (auto &queue_prop : queue_props)
	{
		if ((queue_prop.queueCount > 0) && (queue_prop.queueFlags & VK_QUEUE_GRAPHICS_BIT))
		{
			queue_info.queueFamilyIndex = uint32_t(&queue_prop - queue_props.data());
			break;
		}
	}

	vector<const char *> active_device_layers;
	if (opts.enable_validation)
	{
		uint32_t device_layer_count = 0;
		if (vkEnumerateDeviceLayerProperties(gpu, &device_layer_count, nullptr) != VK_SUCCESS)
			return false;
		vector<VkLayerProperties> device_layers(device_layer_count);
		if (device_layer_count && vkEnumerateDeviceLayerProperties(gpu, &device_layer_count, device_layers.data()) != VK_SUCCESS)
			return false;

		if (find_layer(device_layers, "VK_LAYER_KHRONOS_validation"))
		{
			active_device_layers.push_back("VK_LAYER_KHRONOS_validation");

			uint32_t validation_ext_count = 0;
			vkEnumerateDeviceExtensionProperties(gpu, "VK_LAYER_KHRONOS_validation", &validation_ext_count, nullptr);
			vector<VkExtensionProperties> validation_extensions(validation_ext_count);
			vkEnumerateDeviceExtensionProperties(gpu, "VK_LAYER_KHRONOS_validation", &validation_ext_count, validation_extensions.data());
			validation_cache = find_extension(validation_extensions, VK_EXT_VALIDATION_CACHE_EXTENSION_NAME);
			if (validation_cache)
				active_device_extensions.push_back(VK_EXT_VALIDATION_CACHE_EXTENSION_NAME);
		}
		else
		{
			LOGE("Cannot find VK_LAYER_KHRONOS_validation layer.\n");
			return false;
		}
	}

	supports_pipeline_feedback = find_if(begin(active_device_extensions), end(active_device_extensions), [](const char *ext) {
		return strcmp(ext, VK_EXT_PIPELINE_CREATION_FEEDBACK_EXTENSION_NAME) == 0;
	}) != end(active_device_extensions);

	amd_shader_info = find_if(begin(active_device_extensions), end(active_device_extensions), [](const char *ext) {
		return strcmp(ext, VK_AMD_SHADER_INFO_EXTENSION_NAME) == 0;
	}) != end(active_device_extensions);

	supports_module_identifiers = features.shader_module_identifier.shaderModuleIdentifier == VK_TRUE;

	VkDeviceCreateInfo device_info = { VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO };
	device_info.pNext = has_device_features2 ? &gpu_features2 : nullptr;
	device_info.pEnabledFeatures = has_device_features2 ? nullptr : &gpu_features2.features;
	device_info.pQueueCreateInfos = &queue_info;
	device_info.queueCreateInfoCount = 1;
	device_info.enabledLayerCount = uint32_t(active_device_layers.size());
	device_info.ppEnabledLayerNames = active_device_layers.empty() ? nullptr : active_device_layers.data();
	device_info.enabledExtensionCount = uint32_t(active_device_extensions.size());
	device_info.ppEnabledExtensionNames = active_device_extensions.empty() ? nullptr : active_device_extensions.data();

	if (device_info.ppEnabledLayerNames)
		for (uint32_t i = 0; i < device_info.enabledLayerCount; i++)
			LOGI("Enabling device layer: %s\n", device_info.ppEnabledLayerNames[i]);

	if (device_info.ppEnabledExtensionNames)
		for (uint32_t i = 0; i < device_info.enabledExtensionCount; i++)
			LOGI("Enabling device extension: %s\n", device_info.ppEnabledExtensionNames[i]);

	if (vkCreateDevice(gpu, &device_info, nullptr, &device) != VK_SUCCESS)
	{
		LOGE("Failed to create device.\n");
		return false;
	}

	if (!feature_filter.init(api_version, active_device_extensions.data(), active_device_extensions.size(),
	                         &gpu_features2, &gpu_props2))
	{
		LOGE("Failed to init feature filter.\n");
		return false;
	}

	feature_filter.set_device_query_interface(this);

	return true;
}